

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

int linklist_5_3::del_same_(LinkList *a,int x)

{
  node *pnVar1;
  LinkList pnVar2;
  LinkList pnVar3;
  node *__ptr;
  
  pnVar2 = *a;
  pnVar1 = (*a)->next;
  do {
    do {
      __ptr = pnVar1;
      pnVar3 = pnVar2;
      pnVar1 = __ptr->next;
      pnVar2 = __ptr;
    } while (__ptr->data != x);
    pnVar3->next = pnVar1;
    free(__ptr);
    pnVar2 = pnVar3;
  } while( true );
}

Assistant:

int del_same_(LinkList &a, int x) {
        LinkList p = a, q = a->next, w;
        while (q != nullptr) {
            if (q->data == x) {
                w = q;
                q = q->next;
                p->next = q;
                free(w);
            } else {
                p = q;
                q = q->next;
            }
        }
    }